

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNamePrinter.h
# Opt level: O0

void __thiscall psy::C::SyntaxNamePrinter::~SyntaxNamePrinter(SyntaxNamePrinter *this)

{
  SyntaxNamePrinter *this_local;
  
  std::
  vector<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ::~vector((vector<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
             *)(this + 0x10));
  C::SyntaxDumper::~SyntaxDumper((SyntaxDumper *)this);
  return;
}

Assistant:

class PSY_C_API SyntaxNamePrinter final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    enum class Style : char
    {
        Plain,
        Decorated
    };

    void print(const SyntaxNode* node, Style style);
    void print(const SyntaxNode* node, Style style, std::ostream& os);

private:
    virtual void nonterminal(const SyntaxNode* node) override;

    std::vector<std::tuple<const SyntaxNode*, int>> dump_;
}